

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O2

vec3 * random_in_unit_disk(void)

{
  vec3 *in_RDI;
  double dVar1;
  double dVar2;
  
  do {
    dVar1 = random_double();
    dVar2 = random_double();
    dVar1 = dVar1 + dVar1 + -1.0;
    dVar2 = dVar2 + dVar2 + -1.0;
  } while (1.0 <= dVar1 * dVar1 + dVar2 * dVar2);
  in_RDI->e[2] = 0.0;
  in_RDI->e[0] = dVar1;
  in_RDI->e[1] = dVar2;
  return in_RDI;
}

Assistant:

inline vec3 random_in_unit_disk() {
    while (true) {
        auto p = vec3(random_double(-1,1), random_double(-1,1), 0);
        if (p.length_squared() >= 1) continue;
        return p;
    }
}